

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_transfer(AMQP_VALUE value,TRANSFER_HANDLE *transfer_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  _Bool local_62;
  _Bool local_61;
  _Bool local_60;
  uchar local_5f;
  _Bool local_5e;
  _Bool local_5d;
  _Bool batchable;
  _Bool aborted;
  _Bool resume;
  receiver_settle_mode rcv_settle_mode;
  _Bool more;
  _Bool settled;
  message_format message_format;
  delivery_tag delivery_tag;
  delivery_number delivery_id;
  handle handle;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  TRANSFER_INSTANCE *transfer_instance;
  TRANSFER_HANDLE *ppTStack_18;
  int result;
  TRANSFER_HANDLE *transfer_handle_local;
  AMQP_VALUE value_local;
  
  ppTStack_18 = transfer_handle;
  transfer_handle_local = (TRANSFER_HANDLE *)value;
  list_value = (AMQP_VALUE)transfer_create_internal();
  *ppTStack_18 = (TRANSFER_HANDLE)list_value;
  if (*ppTStack_18 == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1b05;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)transfer_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      transfer_destroy(*ppTStack_18);
      transfer_instance._4_4_ = 0x1b0d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          transfer_instance._4_4_ = 0x1b41;
        }
        else {
          pAVar3 = amqpvalue_get_list_item(pAStack_30,0);
          if (pAVar3 == (AMQP_VALUE)0x0) {
            transfer_destroy(*ppTStack_18);
            transfer_instance._4_4_ = 0x1b23;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar3);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar3);
              transfer_destroy(*ppTStack_18);
              transfer_instance._4_4_ = 0x1b2d;
            }
            else {
              iVar1 = amqpvalue_get_uint(pAVar3,(uint32_t *)&delivery_tag.field_0xc);
              if (iVar1 == 0) {
                amqpvalue_destroy(pAVar3);
                if ((1 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,1), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_uint(pAVar3,&delivery_tag.length), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1b59;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((2 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,2), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_binary(pAVar3,(amqp_binary *)&resume), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1b76;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((3 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,3), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_uint(pAVar3,(uint32_t *)&stack0xffffffffffffffa4),
                     iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1b93;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((4 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,4), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAVar3,&local_5d), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1bb0;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((5 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,5), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAVar3,&local_5e), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1bcd;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((6 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,6), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_ubyte(pAVar3,&local_5f), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1bea;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((7 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,7), pAVar3 != (AMQP_VALUE)0x0)) {
                  amqpvalue_destroy(pAVar3);
                }
                if ((8 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,8), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAVar3,&local_60), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1c14;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((9 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,9), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAVar3,&local_61), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1c31;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((10 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,10), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAVar3,&local_62), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    transfer_destroy(*ppTStack_18);
                    return 0x1c4e;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)transfer_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                transfer_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy(pAVar3);
                transfer_destroy(*ppTStack_18);
                transfer_instance._4_4_ = 0x1b37;
              }
            }
          }
        }
      }
      else {
        transfer_instance._4_4_ = 0x1b14;
      }
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int amqpvalue_get_transfer(AMQP_VALUE value, TRANSFER_HANDLE* transfer_handle)
{
    int result;
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer_create_internal();
    *transfer_handle = transfer_instance;
    if (*transfer_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            transfer_destroy(*transfer_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* handle */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                transfer_destroy(*transfer_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                transfer_destroy(*transfer_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* delivery-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_number delivery_id;
                                if (amqpvalue_get_delivery_number(item_value, &delivery_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-tag */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_tag delivery_tag;
                                if (amqpvalue_get_delivery_tag(item_value, &delivery_tag) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* message-format */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                message_format message_format;
                                if (amqpvalue_get_message_format(item_value, &message_format) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* settled */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool settled;
                                if (amqpvalue_get_boolean(item_value, &settled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* more */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool more;
                                if (amqpvalue_get_boolean(item_value, &more) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* rcv-settle-mode */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                receiver_settle_mode rcv_settle_mode;
                                if (amqpvalue_get_receiver_settle_mode(item_value, &rcv_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* state */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* resume */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool resume;
                                if (amqpvalue_get_boolean(item_value, &resume) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* aborted */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool aborted;
                                if (amqpvalue_get_boolean(item_value, &aborted) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* batchable */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool batchable;
                                if (amqpvalue_get_boolean(item_value, &batchable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    transfer_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}